

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

Optional<Catch::ColourMode> Catch::Detail::stringToColourMode(StringRef colourMode)

{
  ColourMode *pCVar1;
  uint uVar2;
  ulong in_RDX;
  uint *puVar3;
  ColourMode *pCVar4;
  Optional<Catch::ColourMode> OVar5;
  
  puVar3 = (uint *)colourMode.m_size;
  pCVar4 = (ColourMode *)colourMode.m_start;
  if (in_RDX == 4) {
    if (*puVar3 == 0x69736e61) {
      in_RDX = 1;
    }
    else {
      if (*puVar3 != 0x656e6f6e) goto LAB_001474dd;
      in_RDX = 3;
    }
  }
  else if (in_RDX == 5) {
    uVar2 = (byte)puVar3[1] ^ 0x32 | *puVar3 ^ 0x336e6977;
    in_RDX = (ulong)uVar2;
    if (uVar2 != 0) goto LAB_001474dd;
    in_RDX = CONCAT71((uint7)(uint3)((*puVar3 ^ 0x336e6977) >> 8),2);
  }
  else {
    if (in_RDX != 7) {
LAB_001474dd:
      pCVar1 = (ColourMode *)0x0;
      goto LAB_001474ee;
    }
    in_RDX = (ulong)(*puVar3 ^ 0x61666564);
    pCVar1 = (ColourMode *)0x0;
    if (*(int *)((long)puVar3 + 3) != 0x746c7561 || (*puVar3 ^ 0x61666564) != 0) goto LAB_001474ee;
    in_RDX = 0;
  }
  pCVar1 = pCVar4 + 8;
  pCVar4[8] = (ColourMode)in_RDX;
LAB_001474ee:
  *(ColourMode **)pCVar4 = pCVar1;
  OVar5._8_8_ = in_RDX;
  OVar5.nullableValue = pCVar4;
  return OVar5;
}

Assistant:

Optional<ColourMode> stringToColourMode( StringRef colourMode ) {
            if ( colourMode == "default" ) {
                return ColourMode::PlatformDefault;
            } else if ( colourMode == "ansi" ) {
                return ColourMode::ANSI;
            } else if ( colourMode == "win32" ) {
                return ColourMode::Win32;
            } else if ( colourMode == "none" ) {
                return ColourMode::None;
            } else {
                return {};
            }
        }